

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenModuleRef
BinaryenModuleReadWithFeatures(char *input,size_t inputSize,BinaryenFeatures features)

{
  Module *this;
  iterator __result;
  vector<char,_std::allocator<char>_> *input_00;
  void *__buf;
  Module *pMVar1;
  ParseException *p;
  undefined1 local_458 [8];
  WasmBinaryReader parser;
  allocator_type local_51;
  undefined1 local_50 [8];
  vector<char,_std::allocator<char>_> buffer;
  Module *wasm;
  BinaryenFeatures features_local;
  size_t inputSize_local;
  char *input_local;
  
  this = (Module *)operator_new(0x3f0);
  ::wasm::Module::Module(this);
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_50,0,&local_51);
  std::allocator<char>::~allocator(&local_51);
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)local_50,inputSize);
  __result = std::vector<char,_std::allocator<char>_>::begin
                       ((vector<char,_std::allocator<char>_> *)local_50);
  parser._1000_8_ =
       std::
       copy_n<char*,unsigned_long,__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                 (input,inputSize,
                  (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                  __result._M_current);
  ::wasm::FeatureSet::FeatureSet((FeatureSet *)((long)&p + 4),features);
  input_00 = (vector<char,_std::allocator<char>_> *)local_50;
  pMVar1 = this;
  ::wasm::WasmBinaryReader::WasmBinaryReader
            ((WasmBinaryReader *)local_458,this,p._4_4_,input_00,
             (vector<char,_std::allocator<char>_> *)::wasm::defaultEmptySourceMap);
  ::wasm::WasmBinaryReader::read((WasmBinaryReader *)local_458,(int)pMVar1,__buf,(size_t)input_00);
  ::wasm::WasmBinaryReader::~WasmBinaryReader((WasmBinaryReader *)local_458);
  std::
  unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
  ::clear(&this->typeIndices);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_50)
  ;
  return this;
}

Assistant:

BinaryenModuleRef BinaryenModuleReadWithFeatures(char* input,
                                                 size_t inputSize,
                                                 BinaryenFeatures features) {
  auto* wasm = new Module;
  std::vector<char> buffer(false);
  buffer.resize(inputSize);
  std::copy_n(input, inputSize, buffer.begin());
  try {
    WasmBinaryReader parser(*wasm, features, buffer);
    parser.read();
  } catch (ParseException& p) {
    p.dump(std::cerr);
    Fatal() << "error in parsing wasm binary";
  }
  // Do not regress code size by maintaining type order. TODO: Add an option to
  // control this.
  wasm->typeIndices.clear();
  return wasm;
}